

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O2

bool __thiscall
helics::CoreBroker::checkInterfaceCreation
          (CoreBroker *this,ActionMessage *message,InterfaceType type)

{
  HandleManager *this_00;
  BasicHandleInfo *pBVar1;
  __normal_iterator<helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
  _Var2;
  InterfaceType type_00;
  byte *pbVar3;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  format_args args;
  format_args args_00;
  format_args args_01;
  string_view sVar5;
  string local_130;
  ActionMessage eret;
  char *local_58;
  size_t local_50;
  byte *local_48;
  size_type sStack_40;
  byte *local_38;
  size_t local_30;
  size_t sVar4;
  
  this_00 = &this->handles;
  sVar4 = (message->payload).bufferSize;
  pbVar3 = (message->payload).heap;
  type_00 = type;
  if (type == TRANSLATOR) {
    name._M_str = (char *)pbVar3;
    name._M_len = sVar4;
    pBVar1 = HandleManager::getInterfaceHandle(this_00,name,ENDPOINT);
    if ((pBVar1 == (BasicHandleInfo *)0x0) &&
       (name_00._M_str = (char *)(message->payload).heap,
       name_00._M_len = (message->payload).bufferSize,
       pBVar1 = HandleManager::getInterfaceHandle(this_00,name_00,INPUT),
       pBVar1 == (BasicHandleInfo *)0x0)) {
      sVar4 = (message->payload).bufferSize;
      pbVar3 = (message->payload).heap;
      type_00 = PUBLICATION;
      goto LAB_002bff8e;
    }
  }
  else {
LAB_002bff8e:
    name_01._M_str = (char *)pbVar3;
    name_01._M_len = sVar4;
    pBVar1 = HandleManager::getInterfaceHandle(this_00,name_01,type_00);
    if (pBVar1 == (BasicHandleInfo *)0x0) {
      if (type == INPUT) {
        return true;
      }
      if ((this->super_BrokerBase).disableDynamicSources == false) {
        return true;
      }
      if ((this->super_BrokerBase).brokerState._M_i != OPERATING) {
        return true;
      }
      _Var2 = gmlc::containers::
              DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
              ::find(&this->mFederates,&message->source_id);
      if (_Var2._M_current ==
          (this->mFederates).dataStorage.
          super__Vector_base<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        ActionMessage::ActionMessage
                  (&eret,cmd_local_error,
                   (GlobalFederateId)(this->super_BrokerBase).global_broker_id_local.gid,
                   (GlobalFederateId)(message->source_id).gid);
        eret.dest_handle.hid = (message->source_handle).hid;
        eret.messageID = -1;
        sVar5 = interfaceTypeName(type);
        local_58 = sVar5._M_str;
        local_50 = sVar5._M_len;
        sStack_40 = (message->payload).bufferSize;
        local_48 = (message->payload).heap;
        fmt_01.size_ = 0xdd;
        fmt_01.data_ = (char *)0x3b;
        args_01.field_1.args_ = in_R9.args_;
        args_01.desc_ = (unsigned_long_long)&local_58;
        ::fmt::v11::vformat_abi_cxx11_
                  (&local_130,(v11 *)"Source {} not allowed after entering initializing mode ({})",
                   fmt_01,args_01);
        SmallBuffer::operator=
                  (&eret.payload,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_130);
        std::__cxx11::string::~string((string *)&local_130);
        propagateError(this,&eret);
      }
      else {
        if ((((_Var2._M_current)->observer == false) && ((_Var2._M_current)->dynamic == true)) &&
           ((_Var2._M_current)->state == CONNECTED)) {
          return true;
        }
        ActionMessage::ActionMessage
                  (&eret,cmd_local_error,
                   (GlobalFederateId)(this->super_BrokerBase).global_broker_id_local.gid,
                   (GlobalFederateId)(message->source_id).gid);
        eret.dest_handle.hid = (message->source_handle).hid;
        eret.messageID = -1;
        sVar5 = interfaceTypeName(type);
        local_58 = sVar5._M_str;
        local_50 = sVar5._M_len;
        local_30 = (message->payload).bufferSize;
        local_38 = (message->payload).heap;
        local_48 = (byte *)((_Var2._M_current)->name)._M_dataplus._M_p;
        sStack_40 = ((_Var2._M_current)->name)._M_string_length;
        fmt_00.size_ = 0xddd;
        fmt_00.data_ = (char *)0x43;
        args_00.field_1.values_ = in_R9.values_;
        args_00.desc_ = (unsigned_long_long)&local_58;
        ::fmt::v11::vformat_abi_cxx11_
                  (&local_130,
                   (v11 *)"Source {} from {} not allowed after entering initializing mode ({})",
                   fmt_00,args_00);
        SmallBuffer::operator=
                  (&eret.payload,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_130);
        std::__cxx11::string::~string((string *)&local_130);
        propagateError(this,&eret);
      }
      goto LAB_002c002d;
    }
  }
  ActionMessage::ActionMessage
            (&eret,cmd_local_error,
             (GlobalFederateId)(this->super_BrokerBase).global_broker_id_local.gid,
             (GlobalFederateId)(message->source_id).gid);
  eret.dest_handle.hid = (message->source_handle).hid;
  eret.messageID = -1;
  sVar5 = interfaceTypeName(type);
  local_58 = sVar5._M_str;
  local_50 = sVar5._M_len;
  sStack_40 = (message->payload).bufferSize;
  local_48 = (message->payload).heap;
  fmt.size_ = 0xdd;
  fmt.data_ = (char *)0x17;
  args.field_1.args_ = in_R9.args_;
  args.desc_ = (unsigned_long_long)&local_58;
  ::fmt::v11::vformat_abi_cxx11_(&local_130,(v11 *)"Duplicate {} names ({})",fmt,args);
  SmallBuffer::operator=
            (&eret.payload,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  propagateError(this,&eret);
LAB_002c002d:
  ActionMessage::~ActionMessage(&eret);
  return false;
}

Assistant:

bool CoreBroker::checkInterfaceCreation(ActionMessage& message, InterfaceType type)
{
    bool existingName{false};
    if (type == InterfaceType::TRANSLATOR) {
        existingName =
            (handles.getInterfaceHandle(message.name(), InterfaceType::ENDPOINT) != nullptr ||
             handles.getInterfaceHandle(message.name(), InterfaceType::INPUT) != nullptr ||
             handles.getInterfaceHandle(message.name(), InterfaceType::PUBLICATION) != nullptr);
    } else {
        existingName = (handles.getInterfaceHandle(message.name(), type) != nullptr);
    }

    // detect duplicate InterfaceName;
    if (existingName) {
        ActionMessage eret(CMD_LOCAL_ERROR, global_broker_id_local, message.source_id);
        eret.dest_handle = message.source_handle;
        eret.messageID = defs::Errors::REGISTRATION_FAILURE;
        eret.payload =
            fmt::format("Duplicate {} names ({})", interfaceTypeName(type), message.name());
        propagateError(std::move(eret));
        return false;
    }
    if (disableDynamicSources && type != InterfaceType::INPUT) {
        if (getBrokerState() == BrokerState::OPERATING) {
            auto fed = mFederates.find(message.source_id);
            if (fed == mFederates.end()) {
                ActionMessage eret(CMD_LOCAL_ERROR, global_broker_id_local, message.source_id);
                eret.dest_handle = message.source_handle;
                eret.messageID = defs::Errors::REGISTRATION_FAILURE;
                eret.payload =
                    fmt::format("Source {} not allowed after entering initializing mode ({})",
                                interfaceTypeName(type),
                                message.name());
                propagateError(std::move(eret));
                return false;
            }
            if (fed->observer || !fed->dynamic || fed->state != ConnectionState::CONNECTED) {
                ActionMessage eret(CMD_LOCAL_ERROR, global_broker_id_local, message.source_id);
                eret.dest_handle = message.source_handle;
                eret.messageID = defs::Errors::REGISTRATION_FAILURE;
                eret.payload = fmt::format(
                    "Source {} from {} not allowed after entering initializing mode ({})",
                    interfaceTypeName(type),
                    fed->name,
                    message.name());
                propagateError(std::move(eret));
                return false;
            }
        }
    }
    return true;
}